

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcVector.h
# Opt level: O0

void __thiscall o3dgc::Vector<long>::PushBack(Vector<long> *this,long *value)

{
  long lVar1;
  unsigned_long uVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  long *__dest;
  long *tmp;
  long *value_local;
  Vector<long> *this_local;
  
  if (this->m_size == this->m_allocated) {
    this->m_allocated = this->m_allocated << 1;
    if (this->m_allocated < 0x20) {
      this->m_allocated = 0x20;
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = this->m_allocated;
    uVar4 = SUB168(auVar3 * ZEXT816(8),0);
    if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    __dest = (long *)operator_new__(uVar4);
    if (this->m_size != 0) {
      memcpy(__dest,this->m_buffer,this->m_size << 3);
      if (this->m_buffer != (long *)0x0) {
        operator_delete__(this->m_buffer);
      }
    }
    this->m_buffer = __dest;
  }
  if (this->m_allocated <= this->m_size) {
    __assert_fail("m_size < m_allocated",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/Open3DGC/o3dgcVector.h"
                  ,0x58,"void o3dgc::Vector<long>::PushBack(const T &) [T = long]");
  }
  lVar1 = *value;
  uVar2 = this->m_size;
  this->m_size = uVar2 + 1;
  this->m_buffer[uVar2] = lVar1;
  return;
}

Assistant:

void                    PushBack(const T & value)
                                {
                                    if (m_size == m_allocated)
                                    {
                                        m_allocated *= 2;
                                        if (m_allocated < O3DGC_DEFAULT_VECTOR_SIZE)
                                        {
                                            m_allocated = O3DGC_DEFAULT_VECTOR_SIZE;
                                        }
                                        T * tmp      = new T [m_allocated];
                                        if (m_size > 0)
                                        {
                                            memcpy(tmp, m_buffer, m_size * sizeof(T) );
                                            delete [] m_buffer;
                                        }
                                        m_buffer = tmp;
                                    }
                                    assert(m_size < m_allocated);
                                    m_buffer[m_size++] = value;
                                }